

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O2

void __thiscall ON_Triangle::Spin(ON_Triangle *this,uchar move)

{
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  long lVar9;
  long lVar10;
  ON_3dPoint tmp;
  
  if (move % 3 != 0) {
    if (move % 3 == 1) {
      lVar9 = 0x18;
      lVar10 = 0x30;
    }
    else {
      lVar9 = 0x30;
      lVar10 = 0x18;
    }
    dVar4 = this->m_V[0].z;
    dVar5 = this->m_V[0].x;
    dVar6 = this->m_V[0].y;
    this->m_V[0].z = *(double *)((long)&this->m_V[0].z + lVar10);
    pdVar1 = (double *)((long)&this->m_V[0].x + lVar10);
    dVar7 = pdVar1[1];
    this->m_V[0].x = *pdVar1;
    this->m_V[0].y = dVar7;
    *(undefined8 *)((long)&this->m_V[0].z + lVar10) = *(undefined8 *)((long)&this->m_V[0].z + lVar9)
    ;
    puVar2 = (undefined8 *)((long)&this->m_V[0].x + lVar9);
    uVar8 = puVar2[1];
    puVar3 = (undefined8 *)((long)&this->m_V[0].x + lVar10);
    *puVar3 = *puVar2;
    puVar3[1] = uVar8;
    *(double *)((long)&this->m_V[0].z + lVar9) = dVar4;
    pdVar1 = (double *)((long)&this->m_V[0].x + lVar9);
    *pdVar1 = dVar5;
    pdVar1[1] = dVar6;
  }
  return;
}

Assistant:

void ON_Triangle::Spin(unsigned char move)
{
  ON_3dPoint tmp;
  switch (move % 3)
  {
  case 0:
    break;
  case 1:
    tmp = m_V[0];
    m_V[0] = m_V[2];
    m_V[2] = m_V[1];
    m_V[1] = tmp;
    break;
  default: //2
    tmp = m_V[0];
    m_V[0] = m_V[1];
    m_V[1] = m_V[2];
    m_V[2] = tmp;
    break;
  }
}